

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Promise.h
# Opt level: O0

void __thiscall
async_simple::Promise<async_simple::Unit>::~Promise(Promise<async_simple::Unit> *this)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  bool bVar4;
  long *plVar5;
  runtime_error *this_00;
  char *pcVar6;
  long *in_RDI;
  __int_type old;
  __int_type_conflict3 old_1;
  FutureState<async_simple::Unit> *in_stack_ffffffffffffff20;
  
  if (*in_RDI != 0) {
    pvVar3 = (void *)*in_RDI;
    plVar5 = (long *)((long)pvVar3 + 0x48);
    LOCK();
    lVar2 = *plVar5;
    *plVar5 = *plVar5 + -1;
    UNLOCK();
    bVar4 = FutureState<async_simple::Unit>::hasResult(in_stack_ffffffffffffff20);
    if ((!bVar4) && (lVar2 == 1)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Promise is broken");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar6 = (char *)((long)pvVar3 + 1);
    LOCK();
    cVar1 = *pcVar6;
    *pcVar6 = *pcVar6 + -1;
    UNLOCK();
    if ((cVar1 == '\x01') && (pvVar3 != (void *)0x0)) {
      FutureState<async_simple::Unit>::~FutureState((FutureState<async_simple::Unit> *)0x4469ea);
      operator_delete(pvVar3,0x58);
    }
  }
  return;
}

Assistant:

~Promise() {
        if (_sharedState) {
            _sharedState->detachPromise();
        }
    }